

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

int __thiscall Assimp::StreamReader<true,_true>::Get<int>(StreamReader<true,_true> *this)

{
  uint *puVar1;
  uint uVar2;
  runtime_error *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (uint *)((long)this->current + 4);
  if (this->limit < puVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"End of file or stream limit was reached","");
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_007dd738;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = *(uint *)this->current;
  uVar6 = uVar2 >> 8;
  uVar3 = uVar2 >> 0x10;
  uVar5 = uVar2 >> 0x18;
  uVar4 = uVar6;
  if (this->le == false) {
    uVar7 = uVar2 & 0xff;
    uVar2 = uVar5;
    uVar4 = uVar3;
    uVar5 = uVar7;
    uVar3 = uVar6;
  }
  this->current = (int8_t *)puVar1;
  return uVar2 & 0xff | (uVar4 & 0xff) << 8 | (uVar3 & 0xff) << 0x10 | uVar5 << 0x18;
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }